

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3140:43)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3140:43)>
          *this,string *arg)

{
  ColourMode CVar1;
  StringRef colourMode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  BasicResult<Catch::Clara::ParseResultType> local_68;
  ColourMode *local_38 [2];
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_88);
  local_68.m_errorMessage._M_dataplus._M_p = (pointer)&local_68.m_errorMessage.field_2;
  local_68.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type = Ok;
  local_68.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_68.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001a7560;
  local_68.m_errorMessage._M_string_length = 0;
  local_68.m_errorMessage.field_2._M_local_buf[0] = '\0';
  toLower(&local_c8,&local_88);
  colourMode.m_size = (size_type)local_c8._M_dataplus._M_p;
  colourMode.m_start = (char *)local_38;
  Catch::Detail::stringToColourMode(colourMode);
  std::__cxx11::string::~string((string *)&local_c8);
  if (local_38[0] == (ColourMode *)0x0) {
    std::operator+(&local_a8,"colour mode must be one of: default, ansi, win32, or none. \'",
                   &local_88);
    std::operator+(&local_c8,&local_a8,"\' is not recognised");
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&local_c8);
  }
  else {
    CVar1 = *local_38[0];
    if ((CVar1 < 4) && (CVar1 != Win32)) {
      ((this->m_lambda).config)->defaultColourMode = CVar1;
      *(undefined8 *)
       &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
        super_ResultBase.m_type = 0;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001a7560;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
      goto LAB_0014f3c7;
    }
    std::operator+(&local_a8,"colour mode \'",&local_88);
    std::operator+(&local_c8,&local_a8,"\' is not supported in this binary");
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&local_c8);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
LAB_0014f3c7:
  BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }